

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration.c
# Opt level: O0

int registration_service_init(registration_service_handle *rs)

{
  int local_24;
  void *pvStack_20;
  int ret;
  registration_service_priv *priv;
  registration_service_handle *rs_local;
  
  pvStack_20 = rs->priv;
  if (pvStack_20 == (void *)0x0) {
    pvStack_20 = calloc(1,0x60);
    if (pvStack_20 == (void *)0x0) {
      return -0xc;
    }
    rs->priv = pvStack_20;
  }
  local_24 = mutex_init((mutex_handle *)((long)pvStack_20 + 0x20));
  if (local_24 == 0) {
    *(registration_service_handle **)((long)pvStack_20 + 0x38) = rs;
    *(code **)((long)pvStack_20 + 0x30) = registration_func;
    *(undefined4 *)((long)pvStack_20 + 0x44) = 600000;
    *(undefined4 *)((long)pvStack_20 + 0x40) = 0x100000;
    local_24 = worker_init((worker_handle *)((long)pvStack_20 + 0x28));
    if (local_24 == 0) {
      if (*(int *)((long)pvStack_20 + 0x58) == 3) {
        *(undefined4 *)((long)pvStack_20 + 0x58) = 0;
      }
      return 0;
    }
  }
  worker_free((worker_handle *)((long)pvStack_20 + 0x28));
  mutex_free((mutex_handle *)((long)pvStack_20 + 0x20));
  free(rs->priv);
  rs->priv = (void *)0x0;
  return local_24;
}

Assistant:

int registration_service_init(struct registration_service_handle *rs)
{
	struct registration_service_priv *priv = rs->priv;
	int ret;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		rs->priv = priv;
	}

	ret = mutex_init(&priv->mutex);
	if (ret != 0)
		goto registration_service_init_exit;

	priv->worker.func_ctx = rs;
	priv->worker.func_ptr = registration_func;
	priv->worker.periodic_wake = UPDATE_INTERVAL;
	priv->worker.stack_size = 1024 * 1024;
	ret = worker_init(&priv->worker);
	if (ret != 0)
		goto registration_service_init_exit;

	if (priv->status == REGISTRATION_STATUS_OFF)
		priv->status = REGISTRATION_STATUS_UNKNOWN;

	return 0;

registration_service_init_exit:
	worker_free(&priv->worker);
	mutex_free(&priv->mutex);

	free(rs->priv);
	rs->priv = NULL;

	return ret;
}